

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ay_Emu.cpp
# Opt level: O1

blargg_err_t __thiscall Ay_Emu::load_mem_(Ay_Emu *this,byte_ *in,long size)

{
  header_t *phVar1;
  blargg_err_t pcVar2;
  int iVar3;
  
  pcVar2 = parse_header(in,size,&this->file);
  if (pcVar2 != (blargg_err_t)0x0) {
    return pcVar2;
  }
  phVar1 = (this->file).header;
  iVar3 = phVar1->max_track + 1;
  (this->super_Classic_Emu).super_Music_Emu.super_Gme_File.raw_track_count_ = iVar3;
  (this->super_Classic_Emu).super_Music_Emu.super_Gme_File.track_count_ = iVar3;
  if (2 < phVar1->vers) {
    (this->super_Classic_Emu).super_Music_Emu.super_Gme_File.warning_ = "Unknown file version";
  }
  (this->super_Classic_Emu).super_Music_Emu.voice_count_ = 4;
  Blip_Synth_::volume_unit
            (&(this->apu).synth_.impl,
             (this->super_Classic_Emu).super_Music_Emu.gain_ * 0.000915032679738562);
  pcVar2 = Classic_Emu::setup_buffer(&this->super_Classic_Emu,0x361f14);
  return pcVar2;
}

Assistant:

blargg_err_t Ay_Emu::load_mem_( byte const* in, long size )
{
	assert( offsetof (header_t,track_info [2]) == header_size );
	
	RETURN_ERR( parse_header( in, size, &file ) );
	set_track_count( file.header->max_track + 1 );
	
	if ( file.header->vers > 2 )
		set_warning( "Unknown file version" );
	
	set_voice_count( osc_count );
	apu.volume( gain() );
	
	return setup_buffer( spectrum_clock );
}